

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O1

bool google::protobuf::compiler::ContainsParentReference(string *path)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  long *local_68;
  string *local_60;
  long local_58 [2];
  long *local_48;
  string *local_40;
  long local_38 [2];
  
  iVar2 = std::__cxx11::string::compare((char *)path);
  bVar5 = true;
  if (iVar2 == 0) {
LAB_00214935:
    bVar1 = false;
  }
  else {
    local_48 = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"../","");
    if (local_40 <= (string *)path->_M_string_length) {
      iVar3 = std::__cxx11::string::compare((ulong)path,0,local_40);
      if (iVar3 == 0) goto LAB_00214935;
    }
    local_68 = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"/..","");
    if (local_60 <= (string *)path->_M_string_length) {
      iVar3 = std::__cxx11::string::compare
                        ((ulong)path,(long)path->_M_string_length - (long)local_60,local_60);
      if (iVar3 == 0) {
        bVar1 = true;
        bVar5 = true;
        goto LAB_00214937;
      }
    }
    lVar4 = std::__cxx11::string::find((char *)path,0x2553fb,0);
    bVar5 = lVar4 != -1;
    bVar1 = true;
  }
LAB_00214937:
  if ((bVar1) && (local_68 != local_58)) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if ((iVar2 != 0) && (local_48 != local_38)) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return bVar5;
}

Assistant:

static inline bool ContainsParentReference(const string& path) {
  return path == ".." ||
         HasPrefixString(path, "../") ||
         HasSuffixString(path, "/..") ||
         path.find("/../") != string::npos;
}